

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

nng_err pipe_get(nng_pipe p,char *name,void *val,size_t *szp,nni_type t)

{
  nni_pipe *local_38;
  nni_pipe *pipe;
  nng_err rv;
  nni_type t_local;
  size_t *szp_local;
  void *val_local;
  char *name_local;
  nng_pipe p_local;
  
  pipe._4_4_ = t;
  _rv = szp;
  szp_local = (size_t *)val;
  val_local = name;
  name_local._0_4_ = p.id;
  pipe._0_4_ = nni_pipe_find(&local_38,p.id);
  name_local._4_4_ = (nng_err)pipe;
  if ((nng_err)pipe == NNG_OK) {
    pipe._0_4_ = nni_pipe_getopt(local_38,(char *)val_local,szp_local,_rv,pipe._4_4_);
    nni_pipe_rele(local_38);
    name_local._4_4_ = (nng_err)pipe;
  }
  return name_local._4_4_;
}

Assistant:

static nng_err
pipe_get(nng_pipe p, const char *name, void *val, size_t *szp, nni_type t)
{
	nng_err   rv;
	nni_pipe *pipe;

	if ((rv = nni_pipe_find(&pipe, p.id)) != 0) {
		return (rv);
	}
	rv = nni_pipe_getopt(pipe, name, val, szp, t);
	nni_pipe_rele(pipe);
	return (rv);
}